

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O3

void evaluation_compiletime<1l,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>,viennamath::op_mult<double>,viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>>
     ::
     apply<viennamath::ct_vector_3<viennamath::ct_constant<4l>,viennamath::ct_constant<6l>,viennamath::ct_constant<8l>>>
               (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_mult<double>,_viennamath::ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>_>
                *e,ct_vector_3<viennamath::ct_constant<4L>,_viennamath::ct_constant<6L>,_viennamath::ct_constant<8L>_>
                   *v,double ref_solution)

{
  long *plVar1;
  ostream *poVar2;
  double dVar3;
  
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(1.0);
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&PTR__rt_expression_interface_0018bcf0;
  plVar1[1] = 0x3ff0000000000000;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(should: ",9);
  poVar2 = std::ostream::_M_insert<double>(ref_solution);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", is: ",6);
  dVar3 = (double)(**(code **)(*plVar1 + 0x30))(0x3ff0000000000000,plVar1);
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  dVar3 = (double)(**(code **)(*plVar1 + 0x30))(0x3ff0000000000000,plVar1);
  if ((1e-08 <= ABS(ref_solution)) || (1e-08 <= ABS(dVar3))) {
    if (ABS(dVar3) <= 1e-08) {
      if (1e-10 <= ABS((dVar3 - ref_solution) / ref_solution)) {
        __assert_fail("fabs(fabs(a-b) / fabs(b)) < 1e-10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_evaluation.cpp"
                      ,0x50,"void fuzzy_check(double, double)");
      }
    }
    else if (1e-10 <= ABS((dVar3 - ref_solution) / dVar3)) {
      __assert_fail("fabs(fabs(a-b) / fabs(a)) < 1e-10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/viennamath[P]viennamath-dev/tests/src/compiletime_evaluation.cpp"
                    ,0x4e,"void fuzzy_check(double, double)");
    }
  }
  (**(code **)(*plVar1 + 8))(plVar1);
  return;
}

Assistant:

static void apply(E const & e, VectorType const & v, double ref_solution)
  {
    std::cout.precision(17);
    std::cout << viennamath::eval(e, v);
    viennamath::expr temp(viennamath::eval(e, v));
    std::cout <<  "(should: " << ref_solution << ", is: " << temp(1.0) << ")" << std::endl;
    fuzzy_check(temp(1.0), ref_solution);
  }